

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DG2Dot.h
# Opt level: O3

bool __thiscall
dg::debug::DG2Dot<dg::LLVMNode>::dump
          (DG2Dot<dg::LLVMNode> *this,char *new_file,char *only_functions)

{
  bool bVar1;
  _Rb_tree_node_base *p_Var2;
  
  bVar1 = ensureFile(this,new_file);
  if (bVar1) {
    start(this);
    dumpBBs(this,this->dg,1);
    dump_nodes(this);
    dump_edges(this);
    if ((this->subgraphs)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&this->out,"\n\t/* ----------- SUBGRAPHS ---------- */\n\n",0x2a);
    }
    for (p_Var2 = (this->subgraphs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var2 != &(this->subgraphs)._M_t._M_impl.super__Rb_tree_header;
        p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
      dump_subgraph(this,*(DependenceGraph<dg::LLVMNode> **)(p_Var2 + 1));
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&this->out,"}\n",2);
    std::ofstream::close();
  }
  return bVar1;
}

Assistant:

virtual bool dump(const char *new_file = nullptr,
                      const char *only_functions = nullptr) {
        (void) only_functions;

        if (!ensureFile(new_file))
            return false;

        start();

#ifdef ENABLE_CFG
        dumpBBs(dg);
#endif

        // even when we have printed nodes while
        // going through BBs, print nodes again,
        // so that we'll see if there are any nodes
        // that are not in BBs
        dump_nodes();
        dump_edges();

        // print subgraphs once we printed all the nodes
        if (!subgraphs.empty())
            out << "\n\t/* ----------- SUBGRAPHS ---------- */\n\n";
        for (auto sub : subgraphs) {
            dump_subgraph(sub);
        }

        end();

        out.close();
        return true;
    }